

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

void __thiscall Liby::EventLoopGroup::EventLoopGroup(EventLoopGroup *this,int n,string *chooser)

{
  __shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2> *this_00;
  reference ppEVar1;
  element_type *local_48;
  undefined1 local_40 [24];
  int i;
  string *local_20;
  string *chooser_local;
  EventLoopGroup *pEStack_10;
  int n_local;
  EventLoopGroup *this_local;
  
  this->n_ = n;
  local_20 = chooser;
  chooser_local._4_4_ = n;
  pEStack_10 = this;
  std::function<bool_()>::function(&this->bf_);
  std::__cxx11::string::string((string *)&this->chooser_,(string *)local_20);
  std::vector<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ::vector(&this->loops_);
  std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::vector(&this->ploops_);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads_);
  for (local_40._16_4_ = 0; (int)local_40._16_4_ < chooser_local._4_4_ + 1;
      local_40._16_4_ = local_40._16_4_ + 1) {
    std::make_shared<Liby::EventLoop,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::vector<std::shared_ptr<Liby::EventLoop>,std::allocator<std::shared_ptr<Liby::EventLoop>>>::
    emplace_back<std::shared_ptr<Liby::EventLoop>>
              ((vector<std::shared_ptr<Liby::EventLoop>,std::allocator<std::shared_ptr<Liby::EventLoop>>>
                *)&this->loops_,(shared_ptr<Liby::EventLoop> *)local_40);
    std::shared_ptr<Liby::EventLoop>::~shared_ptr((shared_ptr<Liby::EventLoop> *)local_40);
    this_00 = &std::
               vector<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
               ::back(&this->loops_)->
               super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>;
    local_48 = std::__shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::push_back
              (&this->ploops_,&local_48);
  }
  ppEVar1 = std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::operator[]
                      (&this->ploops_,0);
  EventLoop::bind_to_thread(*ppEVar1);
  return;
}

Assistant:

EventLoopGroup::EventLoopGroup(int n, const std::string &chooser)
    : n_(n), chooser_(chooser) {
    for (int i = 0; i < n + 1; i++) {
        loops_.emplace_back(std::make_shared<EventLoop>(chooser));
        ploops_.push_back(loops_.back().get());
    }
    ploops_[0]->bind_to_thread();
}